

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

QSpacerItem *
QLayoutPrivate::createSpacerItem(QLayout *layout,int w,int h,Policy hPolicy,Policy vPolicy)

{
  QSpacerItem *pQVar1;
  
  if ((spacerItemFactoryMethod != (QSpacerItemFactoryMethod)0x0) &&
     (pQVar1 = (*spacerItemFactoryMethod)(layout,w,h,hPolicy,vPolicy), pQVar1 != (QSpacerItem *)0x0)
     ) {
    return pQVar1;
  }
  pQVar1 = (QSpacerItem *)operator_new(0x28);
  QSpacerItem::QSpacerItem(pQVar1,w,h,hPolicy,vPolicy);
  return pQVar1;
}

Assistant:

QSpacerItem *QLayoutPrivate::createSpacerItem(const QLayout *layout, int w, int h, QSizePolicy::Policy hPolicy, QSizePolicy::Policy vPolicy)
{
    if (spacerItemFactoryMethod)
        if (QSpacerItem *si = (*spacerItemFactoryMethod)(layout, w, h, hPolicy, vPolicy))
            return si;
    return new QSpacerItem(w, h,  hPolicy, vPolicy);
}